

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

counting_iterator __thiscall
fmt::v6::internal::float_writer<wchar_t>::prettify<fmt::v6::internal::counting_iterator>
          (float_writer<wchar_t> *this,counting_iterator it)

{
  counting_iterator it_00;
  counting_iterator it_01;
  counting_iterator it_02;
  counting_iterator it_03;
  counting_iterator it_04;
  counting_iterator cVar1;
  size_t in_RSI;
  long *in_RDI;
  bool bVar2;
  int num_digits_1;
  int num_zeros_3;
  int num_zeros_2;
  int num_digits;
  int num_zeros_1;
  bool trailing_zeros;
  int num_zeros;
  int full_exp;
  counting_iterator *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  wchar_t *pwVar3;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  wchar_t *in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffe04;
  counting_iterator in_stack_fffffffffffffe08;
  char local_1e9;
  byte local_1d9;
  counting_iterator local_1a0;
  value_type local_195;
  int local_194;
  int local_190;
  int in_stack_fffffffffffffe74;
  counting_iterator in_stack_fffffffffffffe78;
  value_type local_179;
  wchar_t local_178 [2];
  size_t local_170;
  int local_15c;
  size_t local_158;
  size_t local_150;
  counting_iterator local_140;
  value_type local_131;
  size_t local_130;
  counting_iterator local_120;
  value_type local_115;
  int local_114;
  size_t local_108;
  undefined4 local_fc;
  size_t local_f8;
  counting_iterator local_e0;
  value_type local_d5;
  wchar_t local_d4;
  int local_d0;
  counting_iterator local_c8;
  value_type local_bd;
  undefined4 local_bc;
  size_t local_b8;
  size_t local_b0;
  size_t local_a0;
  size_t local_98;
  counting_iterator local_88;
  value_type local_79;
  wchar_t local_78 [2];
  size_t local_70;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  counting_iterator local_48;
  value_type local_3a;
  byte local_39;
  int local_38;
  counting_iterator local_30;
  value_type local_21;
  wchar_t local_20;
  int local_1c;
  size_t local_10;
  size_t local_8;
  
  local_1c = (int)in_RDI[1] + *(int *)((long)in_RDI + 0xc);
  local_10 = in_RSI;
  if ((char)*(undefined4 *)((long)in_RDI + 0x1c) == '\x01') {
    local_20 = (wchar_t)*(char *)*in_RDI;
    local_30 = counting_iterator::operator++(in_stack_fffffffffffffdd8,0);
    counting_iterator::operator*(&local_30);
    counting_iterator::value_type::operator=(&local_21,&local_20);
    local_38 = (int)in_RDI[3] - (int)in_RDI[1];
    local_1d9 = 0;
    if (0 < local_38) {
      local_1d9 = (byte)(*(uint *)((long)in_RDI + 0x1c) >> 0x15) & 1;
    }
    local_39 = local_1d9;
    if ((1 < (int)in_RDI[1]) || (local_1d9 != 0)) {
      local_48 = counting_iterator::operator++(in_stack_fffffffffffffdd8,0);
      counting_iterator::operator*(&local_48);
      counting_iterator::value_type::operator=(&local_3a,(wchar_t *)(in_RDI + 4));
    }
    local_60 = local_10;
    it_00.count_._7_1_ = in_stack_fffffffffffffdef;
    it_00.count_._0_7_ = in_stack_fffffffffffffde8;
    local_58 = (size_t)copy_str<wchar_t,_const_char_*,_fmt::v6::internal::counting_iterator,_0>
                                 (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8,it_00)
    ;
    local_10 = local_58;
    if ((local_39 & 1) != 0) {
      local_78[1] = 0x30;
      local_70 = local_58;
      local_68 = (size_t)std::fill_n<fmt::v6::internal::counting_iterator,int,wchar_t>
                                   (in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                                    in_stack_fffffffffffffdf8);
      local_10 = local_68;
    }
    local_1e9 = 'E';
    if ((*(uint *)((long)in_RDI + 0x1c) & 0x10000) == 0) {
      local_1e9 = 'e';
    }
    local_78[0] = (wchar_t)local_1e9;
    local_88 = counting_iterator::operator++(in_stack_fffffffffffffdd8,0);
    counting_iterator::operator*(&local_88);
    counting_iterator::value_type::operator=(&local_79,local_78);
    local_98 = local_10;
    local_8 = (size_t)write_exponent<wchar_t,fmt::v6::internal::counting_iterator>
                                (in_stack_fffffffffffffe74,in_stack_fffffffffffffe78);
  }
  else {
    if (local_1c < (int)in_RDI[1]) {
      if (local_1c < 1) {
        local_178[0] = L'0';
        counting_iterator::operator++(in_stack_fffffffffffffdd8,0);
        counting_iterator::operator*((counting_iterator *)&stack0xfffffffffffffe78);
        counting_iterator::value_type::operator=(&local_179,local_178);
        local_190 = -local_1c;
        if ((-1 < (int)in_RDI[3]) && ((int)in_RDI[3] < local_190)) {
          local_190 = (int)in_RDI[3];
        }
        local_194 = (int)in_RDI[1];
        if ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) == 0) {
          while( true ) {
            bVar2 = false;
            if (0 < local_194) {
              bVar2 = *(char *)(*in_RDI + (long)(local_194 + -1)) == '0';
            }
            if (!bVar2) break;
            local_194 = local_194 + -1;
          }
          in_stack_fffffffffffffdef = 0;
        }
        if ((local_190 != 0) || (local_194 != 0)) {
          pwVar3 = (wchar_t *)(in_RDI + 4);
          local_1a0 = counting_iterator::operator++(in_stack_fffffffffffffdd8,0);
          counting_iterator::operator*(&local_1a0);
          counting_iterator::value_type::operator=(&local_195,pwVar3);
          local_10 = (size_t)std::fill_n<fmt::v6::internal::counting_iterator,int,wchar_t>
                                       (in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                                        in_stack_fffffffffffffdf8);
          cVar1.count_._7_1_ = in_stack_fffffffffffffdef;
          cVar1.count_._0_7_ = in_stack_fffffffffffffde8;
          local_10 = (size_t)copy_str<wchar_t,_const_char_*,_fmt::v6::internal::counting_iterator,_0>
                                       ((char *)pwVar3,(char *)in_stack_fffffffffffffdd8,cVar1);
        }
      }
      else {
        it_02.count_._7_1_ = in_stack_fffffffffffffdef;
        it_02.count_._0_7_ = in_stack_fffffffffffffde8;
        local_108 = (size_t)copy_str<wchar_t,_const_char_*,_fmt::v6::internal::counting_iterator,_0>
                                      (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8,
                                       it_02);
        local_10 = local_108;
        if ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) == 0) {
          local_114 = (int)in_RDI[1];
          while( true ) {
            bVar2 = false;
            if (local_1c < local_114) {
              bVar2 = *(char *)(*in_RDI + (long)(local_114 + -1)) == '0';
            }
            if (!bVar2) break;
            local_114 = local_114 + -1;
          }
          if (local_114 != local_1c) {
            pwVar3 = (wchar_t *)(in_RDI + 4);
            local_120 = counting_iterator::operator++(in_stack_fffffffffffffdd8,0);
            counting_iterator::operator*(&local_120);
            counting_iterator::value_type::operator=(&local_115,pwVar3);
          }
          local_130 = local_10;
          it_03.count_._7_1_ = in_stack_fffffffffffffdef;
          it_03.count_._0_7_ = in_stack_fffffffffffffde8;
          cVar1 = copy_str<wchar_t,_const_char_*,_fmt::v6::internal::counting_iterator,_0>
                            (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8,it_03);
          return (counting_iterator)cVar1.count_;
        }
        local_140 = counting_iterator::operator++(in_stack_fffffffffffffdd8,0);
        counting_iterator::operator*(&local_140);
        counting_iterator::value_type::operator=(&local_131,(wchar_t *)(in_RDI + 4));
        local_158 = local_10;
        it_04.count_._7_1_ = in_stack_fffffffffffffdef;
        it_04.count_._0_7_ = in_stack_fffffffffffffde8;
        local_170 = (size_t)copy_str<wchar_t,_const_char_*,_fmt::v6::internal::counting_iterator,_0>
                                      (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8,
                                       it_04);
        local_10 = local_170;
        if ((int)in_RDI[1] < (int)in_RDI[3]) {
          local_15c = (int)in_RDI[3] - (int)in_RDI[1];
          local_178[1] = 0x30;
          local_150 = local_170;
          local_10 = (size_t)std::fill_n<fmt::v6::internal::counting_iterator,int,wchar_t>
                                       (in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                                        in_stack_fffffffffffffdf8);
        }
      }
    }
    else {
      it_01.count_._7_1_ = in_stack_fffffffffffffdef;
      it_01.count_._0_7_ = in_stack_fffffffffffffde8;
      local_b8 = (size_t)copy_str<wchar_t,_const_char_*,_fmt::v6::internal::counting_iterator,_0>
                                   (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8,
                                    it_01);
      local_bc = 0x30;
      local_a0 = local_b8;
      local_10 = local_b8;
      local_b0 = (size_t)std::fill_n<fmt::v6::internal::counting_iterator,int,wchar_t>
                                   (in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                                    in_stack_fffffffffffffdf8);
      local_10 = local_b0;
      if ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) != 0) {
        cVar1.count_ = (size_t)(in_RDI + 4);
        local_c8 = counting_iterator::operator++(in_stack_fffffffffffffdd8,0);
        counting_iterator::operator*(&local_c8);
        counting_iterator::value_type::operator=(&local_bd,(wchar_t *)cVar1.count_);
        local_d0 = (int)in_RDI[3] - local_1c;
        if (local_d0 < 1) {
          if ((char)*(undefined4 *)((long)in_RDI + 0x1c) != '\x02') {
            local_d4 = L'0';
            local_e0 = counting_iterator::operator++(in_stack_fffffffffffffdd8,0);
            counting_iterator::operator*(&local_e0);
            counting_iterator::value_type::operator=(&local_d5,&local_d4);
          }
          return (counting_iterator)local_10;
        }
        local_f8 = local_10;
        local_fc = 0x30;
        local_10 = (size_t)std::fill_n<fmt::v6::internal::counting_iterator,int,wchar_t>
                                     (cVar1,in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8);
      }
    }
    local_8 = local_10;
  }
  return (counting_iterator)local_8;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }